

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTTP_Server.cpp
# Opt level: O3

bool __thiscall Jupiter::HTTP::Server::Data::has(Data *this,string_view hostname,string_view name)

{
  pointer puVar1;
  Host *pHVar2;
  pointer puVar3;
  __uniq_ptr_data<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>,_true,_true>
  _Var4;
  bool bVar5;
  int iVar6;
  int iVar7;
  char *pcVar8;
  byte bVar9;
  char *__n;
  uint uVar10;
  pointer puVar11;
  byte bVar12;
  size_t sVar13;
  pointer puVar14;
  basic_string_view<char,_std::char_traits<char>_> lhs;
  
  __n = (char *)name._M_len;
  pcVar8 = __n;
  if (hostname._M_len == 0) {
    uVar10 = 0;
  }
  else {
    sVar13 = 0;
    uVar10 = 0;
    do {
      iVar6 = jessilib::fold((int)hostname._M_str[sVar13]);
      uVar10 = uVar10 + iVar6;
      sVar13 = sVar13 + 1;
    } while (hostname._M_len != sVar13);
  }
  puVar14 = (this->m_hosts).
            super__Vector_base<std::unique_ptr<Jupiter::HTTP::Server::Host,_std::default_delete<Jupiter::HTTP::Server::Host>_>,_std::allocator<std::unique_ptr<Jupiter::HTTP::Server::Host,_std::default_delete<Jupiter::HTTP::Server::Host>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->m_hosts).
           super__Vector_base<std::unique_ptr<Jupiter::HTTP::Server::Host,_std::default_delete<Jupiter::HTTP::Server::Host>_>,_std::allocator<std::unique_ptr<Jupiter::HTTP::Server::Host,_std::default_delete<Jupiter::HTTP::Server::Host>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    bVar9 = (byte)pcVar8;
    if (puVar14 == puVar1) {
      bVar12 = 0;
LAB_0012a55d:
      return (bool)(bVar12 & bVar9);
    }
    pHVar2 = (puVar14->_M_t).
             super___uniq_ptr_impl<Jupiter::HTTP::Server::Host,_std::default_delete<Jupiter::HTTP::Server::Host>_>
             ._M_t.
             super__Tuple_impl<0UL,_Jupiter::HTTP::Server::Host_*,_std::default_delete<Jupiter::HTTP::Server::Host>_>
             .super__Head_base<0UL,_Jupiter::HTTP::Server::Host_*,_false>._M_head_impl;
    if ((uVar10 == (pHVar2->super_Directory).name_checksum) &&
       (lhs._M_str = (pHVar2->super_Directory).name._M_dataplus._M_p,
       lhs._M_len = *(size_type *)((long)&(pHVar2->super_Directory).name + 8),
       pcVar8 = hostname._M_str, bVar5 = jessilib::equalsi<char,char>(lhs,hostname), bVar5)) {
      if (__n == (char *)0x0) {
        iVar6 = 0;
      }
      else {
        pcVar8 = (char *)0x0;
        iVar6 = 0;
        do {
          iVar6 = iVar6 + name._M_str[(long)pcVar8];
          pcVar8 = pcVar8 + 1;
        } while (__n != pcVar8);
      }
      pHVar2 = (puVar14->_M_t).
               super___uniq_ptr_impl<Jupiter::HTTP::Server::Host,_std::default_delete<Jupiter::HTTP::Server::Host>_>
               ._M_t.
               super__Tuple_impl<0UL,_Jupiter::HTTP::Server::Host_*,_std::default_delete<Jupiter::HTTP::Server::Host>_>
               .super__Head_base<0UL,_Jupiter::HTTP::Server::Host_*,_false>._M_head_impl;
      puVar11 = *(pointer *)
                 &(pHVar2->super_Directory).content.
                  super__Vector_base<std::unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>,_std::allocator<std::unique_ptr<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>_>_>
                  ._M_impl;
      puVar3 = *(pointer *)((long)&(pHVar2->super_Directory).content + 8);
      do {
        if (puVar11 == puVar3) {
          bVar9 = 0;
          bVar12 = 1;
          goto LAB_0012a55d;
        }
        _Var4.
        super___uniq_ptr_impl<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
        ._M_t.
        super__Tuple_impl<0UL,_Jupiter::HTTP::Server::Content_*,_std::default_delete<Jupiter::HTTP::Server::Content>_>
        .super__Head_base<0UL,_Jupiter::HTTP::Server::Content_*,_false>._M_head_impl =
             (puVar11->_M_t).
             super___uniq_ptr_impl<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
        ;
        if ((iVar6 == *(int *)((long)_Var4.
                                     super___uniq_ptr_impl<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_Jupiter::HTTP::Server::Content_*,_std::default_delete<Jupiter::HTTP::Server::Content>_>
                                     .super__Head_base<0UL,_Jupiter::HTTP::Server::Content_*,_false>
                                     ._M_head_impl + 0x38)) &&
           (*(char **)((long)_Var4.
                             super___uniq_ptr_impl<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_Jupiter::HTTP::Server::Content_*,_std::default_delete<Jupiter::HTTP::Server::Content>_>
                             .super__Head_base<0UL,_Jupiter::HTTP::Server::Content_*,_false>.
                             _M_head_impl + 0x20) == __n)) {
          bVar12 = 1;
          if (__n == (char *)0x0) {
            bVar9 = 1;
            goto LAB_0012a55d;
          }
          iVar7 = bcmp(name._M_str,
                       *(void **)((long)_Var4.
                                        super___uniq_ptr_impl<Jupiter::HTTP::Server::Content,_std::default_delete<Jupiter::HTTP::Server::Content>_>
                                        ._M_t.
                                        super__Tuple_impl<0UL,_Jupiter::HTTP::Server::Content_*,_std::default_delete<Jupiter::HTTP::Server::Content>_>
                                        .
                                        super__Head_base<0UL,_Jupiter::HTTP::Server::Content_*,_false>
                                        ._M_head_impl + 0x18),(size_t)__n);
          bVar9 = 1;
          if (iVar7 == 0) goto LAB_0012a55d;
        }
        puVar11 = puVar11 + 1;
      } while( true );
    }
    puVar14 = puVar14 + 1;
  } while( true );
}

Assistant:

bool Jupiter::HTTP::Server::Data::has(std::string_view hostname, std::string_view name) {
	unsigned int name_checksum = calc_checksumi(hostname);
	for (const auto& host : m_hosts) {
		if (name_checksum == host->name_checksum && jessilib::equalsi(host->name, hostname)) {
			name_checksum = calc_checksum(name); // switch to equalsi to make case-insensitive
			for (const auto& content : host->content) {
				if (name_checksum == content->name_checksum && content->name == name) { // switch to equalsi to make case-insensitive
					return true;
				}
			}
			return false;
		}
	}
	return false;
}